

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O0

void * gdImageGdPtr(gdImagePtr im,int *size)

{
  gdIOCtx *out_00;
  gdIOCtx *out;
  void *rv;
  int *size_local;
  gdImagePtr im_local;
  
  out_00 = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out_00 == (gdIOCtx *)0x0) {
    im_local = (gdImagePtr)0x0;
  }
  else {
    _gdImageGd(im,out_00);
    im_local = (gdImagePtr)gdDPExtractData(out_00,size);
    (*out_00->gd_free)(out_00);
  }
  return im_local;
}

Assistant:

BGD_DECLARE(void *) gdImageGdPtr (gdImagePtr im, int *size)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx (2048, NULL);
	if (out == NULL) return NULL;
	_gdImageGd (im, out);
	rv = gdDPExtractData (out, size);
	out->gd_free (out);
	return rv;
}